

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O0

UINT8 device_start_k051649(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  DEV_DATA devData;
  k051649_state *info;
  DEV_INFO *retDevInf_local;
  DEV_GEN_CFG *cfg_local;
  
  devData.chipInf = calloc(1,0xf0);
  if ((DEV_DATA *)devData.chipInf == (DEV_DATA *)0x0) {
    cfg_local._7_1_ = 0xff;
  }
  else {
    *(UINT8 *)((long)devData.chipInf + 0xee) = cfg->flags;
    *(UINT32 *)((long)devData.chipInf + 0xe4) = cfg->clock;
    *(uint *)&((DEV_DATA *)((long)devData.chipInf + 0xe8))->chipInf =
         *(uint *)((long)devData.chipInf + 0xe4) >> 4;
    k051649_set_mute_mask(devData.chipInf,0);
    *(void **)devData.chipInf = devData.chipInf;
    INIT_DEVINF(retDevInf,(DEV_DATA *)devData.chipInf,*(UINT32 *)((long)devData.chipInf + 0xe8),
                &devDef);
    cfg_local._7_1_ = '\0';
  }
  return cfg_local._7_1_;
}

Assistant:

static UINT8 device_start_k051649(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	k051649_state *info;

	info = (k051649_state *)calloc(1, sizeof(k051649_state));
	if (info == NULL)
		return 0xFF;

	// get stream channels
	info->mode_plus = cfg->flags;
	info->mclock = cfg->clock;
	info->rate = info->mclock / 16;

	k051649_set_mute_mask(info, 0x00);
	
	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->rate, &devDef);
	return 0x00;
}